

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ninja.cc
# Opt level: O2

int __thiscall
anon_unknown.dwarf_38a::NinjaMain::ToolRestat(NinjaMain *this,Options *options,int argc,char **argv)

{
  BuildLog *this_00;
  StringPiece path;
  int iVar1;
  bool bVar2;
  int iVar3;
  LoadStatus LVar4;
  char *msg;
  long lVar5;
  string err;
  string log_path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  _optind = 1;
  iVar3 = getopt(argc + 1,argv + -1,"h");
  iVar1 = _optind;
  if (iVar3 == -1) {
    lVar5 = (long)_optind;
    bVar2 = EnsureBuildDirExists(this);
    if (bVar2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&log_path,".ninja_log",(allocator<char> *)&err);
      if ((this->build_dir_)._M_string_length != 0) {
        std::operator+(&local_50,&this->build_dir_,"/");
        std::operator+(&err,&local_50,&log_path);
        std::__cxx11::string::operator=((string *)&log_path,(string *)&err);
        std::__cxx11::string::~string((string *)&err);
        std::__cxx11::string::~string((string *)&local_50);
      }
      err._M_dataplus._M_p = (pointer)&err.field_2;
      err._M_string_length = 0;
      err.field_2._M_local_buf[0] = '\0';
      this_00 = &this->build_log_;
      LVar4 = BuildLog::Load(this_00,&log_path,&err);
      iVar3 = 0;
      if (LVar4 != LOAD_NOT_FOUND) {
        if (LVar4 == LOAD_ERROR) {
          Error("loading build log %s: %s",log_path._M_dataplus._M_p,err._M_dataplus._M_p);
        }
        else {
          if (err._M_string_length != 0) {
            Warning("%s",err._M_dataplus._M_p);
            err._M_string_length = 0;
            *err._M_dataplus._M_p = '\0';
          }
          path.len_ = log_path._M_string_length;
          path.str_ = log_path._M_dataplus._M_p;
          bVar2 = BuildLog::Restat(this_00,path,&(this->disk_interface_).super_DiskInterface,
                                   (argc + 1) - iVar1,argv + -1 + lVar5,&err);
          if (bVar2) {
            if ((this->config_->dry_run != false) ||
               (bVar2 = BuildLog::OpenForWrite(this_00,&log_path,&this->super_BuildLogUser,&err),
               iVar3 = 0, bVar2)) goto LAB_00106d03;
            msg = "opening build log: %s";
          }
          else {
            msg = "failed recompaction: %s";
          }
          Error(msg,err._M_dataplus._M_p);
        }
        iVar3 = 1;
      }
LAB_00106d03:
      std::__cxx11::string::~string((string *)&err);
      std::__cxx11::string::~string((string *)&log_path);
      return iVar3;
    }
  }
  else {
    puts("usage: ninja -t restat [outputs]");
  }
  return 1;
}

Assistant:

int NinjaMain::ToolRestat(const Options* options, int argc, char* argv[]) {
  // The restat tool uses getopt, and expects argv[0] to contain the name of the
  // tool, i.e. "restat"
  argc++;
  argv--;

  optind = 1;
  int opt;
  while ((opt = getopt(argc, argv, const_cast<char*>("h"))) != -1) {
    switch (opt) {
    case 'h':
    default:
      printf("usage: ninja -t restat [outputs]\n");
      return 1;
    }
  }
  argv += optind;
  argc -= optind;

  if (!EnsureBuildDirExists())
    return 1;

  string log_path = ".ninja_log";
  if (!build_dir_.empty())
    log_path = build_dir_ + "/" + log_path;

  string err;
  const LoadStatus status = build_log_.Load(log_path, &err);
  if (status == LOAD_ERROR) {
    Error("loading build log %s: %s", log_path.c_str(), err.c_str());
    return EXIT_FAILURE;
  }
  if (status == LOAD_NOT_FOUND) {
    // Nothing to restat, ignore this
    return EXIT_SUCCESS;
  }
  if (!err.empty()) {
    // Hack: Load() can return a warning via err by returning LOAD_SUCCESS.
    Warning("%s", err.c_str());
    err.clear();
  }

  bool success = build_log_.Restat(log_path, disk_interface_, argc, argv, &err);
  if (!success) {
    Error("failed recompaction: %s", err.c_str());
    return EXIT_FAILURE;
  }

  if (!config_.dry_run) {
    if (!build_log_.OpenForWrite(log_path, *this, &err)) {
      Error("opening build log: %s", err.c_str());
      return EXIT_FAILURE;
    }
  }

  return EXIT_SUCCESS;
}